

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int experimental_hooks_prof_dump_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  prof_dump_hook_t in_RAX;
  size_t __n;
  prof_dump_hook_t old_hook;
  
  if (oldp == (void *)0x0 && newp == (void *)0x0) {
    return 0x16;
  }
  old_hook = in_RAX;
  if ((oldp != (void *)0x0) && (old_hook = duckdb_je_prof_dump_hook_get(), oldlenp != (size_t *)0x0)
     ) {
    uVar1 = *oldlenp;
    if (uVar1 != 8) {
      __n = 8;
      if (uVar1 < 8) {
        __n = uVar1;
      }
      switchD_016b45db::default(oldp,&old_hook,__n);
      *oldlenp = __n;
      return 0x16;
    }
    *(prof_dump_hook_t *)oldp = old_hook;
  }
  if (newp != (void *)0x0) {
    if (duckdb_je_opt_prof != true) {
      return 2;
    }
    if (newlen != 8) {
      return 0x16;
    }
    duckdb_je_prof_dump_hook_set(*newp);
  }
  return 0;
}

Assistant:

static int
experimental_hooks_prof_dump_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	if (oldp == NULL && newp == NULL) {
		ret = EINVAL;
		goto label_return;
	}
	if (oldp != NULL) {
		prof_dump_hook_t old_hook =
		    prof_dump_hook_get();
		READ(old_hook, prof_dump_hook_t);
	}
	if (newp != NULL) {
		if (!opt_prof) {
			ret = ENOENT;
			goto label_return;
		}
		prof_dump_hook_t new_hook JEMALLOC_CC_SILENCE_INIT(NULL);
		WRITE(new_hook, prof_dump_hook_t);
		prof_dump_hook_set(new_hook);
	}
	ret = 0;
label_return:
	return ret;
}